

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_set_format.c
# Opt level: O0

void test_read_append_wrong_filter(void)

{
  wchar_t line;
  wchar_t wVar1;
  archive *file;
  wchar_t unaff_retaddr;
  archive *in_stack_00000008;
  void *in_stack_00000010;
  int r;
  archive *a;
  archive_entry *ae;
  archive *in_stack_00000028;
  void *in_stack_ffffffffffffffd8;
  archive_entry **entry;
  archive *in_stack_ffffffffffffffe0;
  wchar_t in_stack_ffffffffffffffe8;
  wchar_t in_stack_ffffffffffffffec;
  char *in_stack_fffffffffffffff8;
  
  file = archive_read_new();
  assertion_assert((char *)file,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  archive_read_set_format(in_stack_00000008,unaff_retaddr);
  assertion_assert((char *)file,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  line = archive_read_append_filter(in_stack_00000028,ae._4_4_);
  if ((line == L'\xffffffec') && (wVar1 = canXz(), wVar1 == L'\0')) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'¡');
    wVar1 = (wchar_t)((ulong)file >> 0x20);
    test_skipping("xz reading not fully supported on this platform");
    archive_read_free((archive *)0x1c7aee);
    assertion_equal_int(in_stack_fffffffffffffff8,wVar1,CONCAT44(line,in_stack_ffffffffffffffe8),
                        (char *)in_stack_ffffffffffffffe0,0,(char *)0x1c7b1c,in_stack_00000010);
    return;
  }
  archive_read_open_memory(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0x1c7b37);
  entry = (archive_entry **)0x0;
  assertion_equal_int(in_stack_fffffffffffffff8,(wchar_t)((ulong)file >> 0x20),
                      CONCAT44(line,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,0,
                      (char *)0x1c7b65,in_stack_00000010);
  archive_read_next_header(in_stack_ffffffffffffffe0,entry);
  assertion_assert((char *)file,line,in_stack_ffffffffffffffe8,(char *)in_stack_ffffffffffffffe0,
                   entry);
  if ((line == L'\xffffffec') && (wVar1 = canXz(), wVar1 != L'\0')) {
    archive_read_close((archive *)0x1c7bb7);
    assertion_equal_int(in_stack_fffffffffffffff8,(wchar_t)((ulong)file >> 0x20),
                        CONCAT44(line,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        (longlong)file,(char *)0x1c7be9,in_stack_00000010);
    wVar1 = (wchar_t)((ulong)file >> 0x20);
  }
  else {
    archive_read_close((archive *)0x1c7bf5);
    assertion_equal_int(in_stack_fffffffffffffff8,(wchar_t)((ulong)file >> 0x20),
                        CONCAT44(line,in_stack_ffffffffffffffe8),(char *)in_stack_ffffffffffffffe0,
                        (longlong)file,(char *)0x1c7c24,in_stack_00000010);
    wVar1 = (wchar_t)((ulong)file >> 0x20);
  }
  archive_read_free((archive *)0x1c7c2e);
  assertion_equal_int(in_stack_fffffffffffffff8,wVar1,CONCAT44(line,in_stack_ffffffffffffffe8),
                      (char *)in_stack_ffffffffffffffe0,0,(char *)0x1c7c5c,in_stack_00000010);
  return;
}

Assistant:

DEFINE_TEST(test_read_append_wrong_filter)
{
  struct archive_entry *ae;
  struct archive *a;
  int r;

  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_set_format(a, ARCHIVE_FORMAT_TAR));
  r = archive_read_append_filter(a, ARCHIVE_FILTER_XZ);
  if (r == ARCHIVE_WARN && !canXz()) {
    skipping("xz reading not fully supported on this platform");
    assertEqualInt(ARCHIVE_OK, archive_read_free(a));
    return;
  }
  assertEqualInt(ARCHIVE_OK,
      archive_read_open_memory(a, archive, sizeof(archive)));
  assertA(archive_read_next_header(a, &ae) < (ARCHIVE_WARN));
  if (r == ARCHIVE_WARN && canXz()) {
    assertEqualIntA(a, ARCHIVE_WARN, archive_read_close(a));
  } else {
    assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  }
  assertEqualInt(ARCHIVE_OK,archive_read_free(a));
}